

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict sexp_fork_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  pid_t pVar1;
  sexp_conflict psVar2;
  sexp_conflict in_RDI;
  sexp_conflict res;
  
  pVar1 = sexp_fork_and_kill_threads(in_RDI);
  psVar2 = (sexp_conflict)sexp_make_integer(in_RDI,(long)pVar1,(long)pVar1 >> 0x3f);
  return psVar2;
}

Assistant:

sexp sexp_fork_stub (sexp ctx, sexp self, sexp_sint_t n) {
  sexp res;
  res = sexp_make_integer(ctx, sexp_fork_and_kill_threads(ctx));
  return res;
}